

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

int Nf_ManComputeArrival(Nf_Man_t *p,Nf_Mat_t *pM,int *pCutSet)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Nf_Obj_t *pNVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  Nf_Mat_t *pNVar10;
  int iVar11;
  ulong uVar12;
  Nf_Mat_t *pNVar13;
  bool bVar14;
  
  uVar1 = *(uint *)pM;
  uVar8 = uVar1 >> 0x14 & 0x3ff;
  if (uVar8 == 0) {
    __assert_fail("h > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x94,"int *Nf_CutFromHandle(int *, int)");
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    __assert_fail("!pM->fCompl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0x738,"int Nf_ManComputeArrival(Nf_Man_t *, Nf_Mat_t *, int *)");
  }
  uVar2 = pCutSet[uVar8];
  if ((uVar2 & 0x1f) == 0) {
    iVar6 = 0;
  }
  else {
    bVar7 = 0;
    uVar12 = 0;
    iVar6 = 0;
    do {
      lVar9 = (long)(pCutSet + uVar8)[(ulong)(((uint)pM->Cfg >> 8) >> (bVar7 & 0x1f) & 0xf) + 1];
      if (lVar9 == 0) {
        return iVar6;
      }
      bVar14 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar12 & 0x1f) & 1) != 0;
      pNVar5 = p->pNfObjs;
      uVar3 = *(uint *)pNVar5[lVar9].M[bVar14];
      uVar4 = *(uint *)(pNVar5[lVar9].M[bVar14] + 1);
      if (-1 < (int)(uVar4 ^ uVar3)) {
        __assert_fail("pD->fBest != pA->fBest",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                      ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
      }
      if ((int)uVar3 < 0) {
        pNVar13 = pNVar5[lVar9].M[bVar14];
      }
      else {
        pNVar13 = (Nf_Mat_t *)0x0;
      }
      pNVar10 = pNVar5[lVar9].M[bVar14] + 1;
      if (-1 < (int)uVar4) {
        pNVar10 = pNVar13;
      }
      iVar11 = *(int *)((long)p->pCells->iDelays + uVar12 * 4 + (ulong)((uVar1 & 0xfffff) * 0x50)) +
               ((Nf_Mat_t *)&pNVar10->field_0x0)->D;
      if (iVar6 <= iVar11) {
        iVar6 = iVar11;
      }
      uVar12 = uVar12 + 1;
      bVar7 = bVar7 + 4;
    } while (((ulong)uVar2 & 0x1f) != uVar12);
  }
  return iVar6;
}

Assistant:

int Nf_ManComputeArrival( Nf_Man_t * p, Nf_Mat_t * pM, int * pCutSet )
{
    int Delay = 0; 
    Nf_Mat_t * pMfan;
    int iVar, fCompl, k;
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( pCutSet, pM->CutH );
    assert( !pM->fCompl );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        pMfan = Nf_ObjMatchBest( p, iVar, fCompl );
        Delay = Abc_MaxInt( Delay, pMfan->D + pCell->iDelays[k] );
    }
    //if ( pM->fCompl ) Delay += p->InvDelayI;
    return Delay;
}